

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::TypeInNameSpace
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,Definition *def,string *suffix)

{
  Namespace *ns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ns = def->defined_namespace;
  std::operator+(&local_40,&def->name,suffix);
  TypeInNameSpace(__return_storage_ptr__,this,ns,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeInNameSpace(const Definition &def,
                              const std::string &suffix = "") const {
    return TypeInNameSpace(def.defined_namespace, def.name + suffix);
  }